

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TextureUnitCase::upload2dArrayTexture
          (TextureUnitCase *this,int texNdx,Context *context)

{
  uint uVar1;
  value_type this_00;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  deUint32 err;
  reference pvVar7;
  reference ppTVar8;
  reference pvVar9;
  TextureFormat texFormat;
  TransferFormat TVar10;
  ConstPixelBufferAccess *pCVar11;
  void *pvVar12;
  int layers;
  int height;
  int width;
  ConstPixelBufferAccess access;
  int levelNdx;
  deUint32 local_50;
  deUint32 dStack_4c;
  TransferFormat formatGl;
  Texture2DArray *texture;
  int ndx2dArray;
  Context *context_local;
  int texNdx_local;
  TextureUnitCase *this_local;
  
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_ndxTexType,(long)texNdx);
  ppTVar8 = std::vector<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>::operator[]
                      (&this->m_textures2dArray,(long)*pvVar7);
  this_00 = *ppTVar8;
  pvVar9 = std::
           vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
           ::operator[](&this->m_textureParams,(long)texNdx);
  texFormat = glu::mapGLInternalFormat(pvVar9->internalFormat);
  TVar10 = glu::getTransferFormat(texFormat);
  (*context->_vptr_Context[0xf])(context,0xcf5,1);
  for (access.m_data._4_4_ = 0; uVar1 = access.m_data._4_4_,
      iVar4 = tcu::TextureLevelPyramid::getNumLevels(&this_00->super_TextureLevelPyramid),
      (int)uVar1 < iVar4; access.m_data._4_4_ = access.m_data._4_4_ + 1) {
    bVar3 = tcu::TextureLevelPyramid::isLevelEmpty
                      (&this_00->super_TextureLevelPyramid,access.m_data._4_4_);
    if (!bVar3) {
      pCVar11 = tcu::TextureLevelPyramid::getLevel
                          (&this_00->super_TextureLevelPyramid,access.m_data._4_4_);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)&height,pCVar11)
      ;
      uVar5 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&height);
      uVar6 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&height);
      iVar4 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)&height);
      uVar2 = access.m_data._4_4_;
      pvVar9 = std::
               vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
               ::operator[](&this->m_textureParams,(long)texNdx);
      uVar1 = pvVar9->internalFormat;
      local_50 = TVar10.format;
      dStack_4c = TVar10.dataType;
      pvVar12 = tcu::ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)&height);
      (*context->_vptr_Context[0x12])
                (context,0x8c1a,(ulong)uVar2,(ulong)uVar1,(ulong)uVar5,(ulong)uVar6,iVar4,0,local_50
                 ,dStack_4c,pvVar12);
      err = (*context->_vptr_Context[0x79])();
      glu::checkError(err,"Set 2d array texture image data",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                      ,0x468);
    }
  }
  return;
}

Assistant:

void TextureUnitCase::upload2dArrayTexture (int texNdx, sglr::Context& context)
{
	int							ndx2dArray	= m_ndxTexType[texNdx];
	const tcu::Texture2DArray*	texture		= m_textures2dArray[ndx2dArray];
	glu::TransferFormat			formatGl	= glu::getTransferFormat(glu::mapGLInternalFormat(m_textureParams[texNdx].internalFormat));

	context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	for (int levelNdx = 0; levelNdx < texture->getNumLevels(); levelNdx++)
	{
		if (texture->isLevelEmpty(levelNdx))
			continue;

		tcu::ConstPixelBufferAccess	access	= texture->getLevel(levelNdx);
		int							width	= access.getWidth();
		int							height	= access.getHeight();
		int							layers	= access.getDepth();

		DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);
		DE_ASSERT(access.getSlicePitch() == access.getFormat().getPixelSize()*width*height);

		context.texImage3D(GL_TEXTURE_2D_ARRAY, levelNdx, m_textureParams[texNdx].internalFormat, width, height, layers, 0 /* border */, formatGl.format, formatGl.dataType, access.getDataPtr());
		GLU_EXPECT_NO_ERROR(context.getError(), "Set 2d array texture image data");
	}
}